

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxExtensions.cpp
# Opt level: O0

int Load_SGIX_pbuffer(void)

{
  uint local_c;
  int numFailed;
  
  sf_ptrc_glXCreateGLXPbufferSGIX =
       (_func_GLXPbufferSGIX_Display_ptr_GLXFBConfigSGIX_uint_uint_int_ptr *)
       IntGetProcAddress("glXCreateGLXPbufferSGIX");
  local_c = (uint)(sf_ptrc_glXCreateGLXPbufferSGIX ==
                  (_func_GLXPbufferSGIX_Display_ptr_GLXFBConfigSGIX_uint_uint_int_ptr *)0x0);
  sf_ptrc_glXDestroyGLXPbufferSGIX =
       (_func_void_Display_ptr_GLXPbufferSGIX *)IntGetProcAddress("glXDestroyGLXPbufferSGIX");
  if (sf_ptrc_glXDestroyGLXPbufferSGIX == (_func_void_Display_ptr_GLXPbufferSGIX *)0x0) {
    local_c = local_c + 1;
  }
  sf_ptrc_glXGetSelectedEventSGIX =
       (_func_void_Display_ptr_GLXDrawable_unsigned_long_ptr *)
       IntGetProcAddress("glXGetSelectedEventSGIX");
  if (sf_ptrc_glXGetSelectedEventSGIX == (_func_void_Display_ptr_GLXDrawable_unsigned_long_ptr *)0x0
     ) {
    local_c = local_c + 1;
  }
  sf_ptrc_glXQueryGLXPbufferSGIX =
       (_func_int_Display_ptr_GLXPbufferSGIX_int_uint_ptr *)
       IntGetProcAddress("glXQueryGLXPbufferSGIX");
  if (sf_ptrc_glXQueryGLXPbufferSGIX == (_func_int_Display_ptr_GLXPbufferSGIX_int_uint_ptr *)0x0) {
    local_c = local_c + 1;
  }
  sf_ptrc_glXSelectEventSGIX =
       (_func_void_Display_ptr_GLXDrawable_unsigned_long *)IntGetProcAddress("glXSelectEventSGIX");
  if (sf_ptrc_glXSelectEventSGIX == (_func_void_Display_ptr_GLXDrawable_unsigned_long *)0x0) {
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

static int Load_SGIX_pbuffer(void)
{
    int numFailed = 0;
    sf_ptrc_glXCreateGLXPbufferSGIX = reinterpret_cast<GLXPbufferSGIX (CODEGEN_FUNCPTR*)(Display*, GLXFBConfigSGIX, unsigned int, unsigned int, int*)>(IntGetProcAddress("glXCreateGLXPbufferSGIX"));
    if (!sf_ptrc_glXCreateGLXPbufferSGIX)
        numFailed++;
    sf_ptrc_glXDestroyGLXPbufferSGIX = reinterpret_cast<void (CODEGEN_FUNCPTR*)(Display*, GLXPbufferSGIX)>(IntGetProcAddress("glXDestroyGLXPbufferSGIX"));
    if (!sf_ptrc_glXDestroyGLXPbufferSGIX)
        numFailed++;
    sf_ptrc_glXGetSelectedEventSGIX = reinterpret_cast<void (CODEGEN_FUNCPTR*)(Display*, GLXDrawable, unsigned long*)>(IntGetProcAddress("glXGetSelectedEventSGIX"));
    if (!sf_ptrc_glXGetSelectedEventSGIX)
        numFailed++;
    sf_ptrc_glXQueryGLXPbufferSGIX = reinterpret_cast<int (CODEGEN_FUNCPTR*)(Display*, GLXPbufferSGIX, int, unsigned int*)>(IntGetProcAddress("glXQueryGLXPbufferSGIX"));
    if (!sf_ptrc_glXQueryGLXPbufferSGIX)
        numFailed++;
    sf_ptrc_glXSelectEventSGIX = reinterpret_cast<void (CODEGEN_FUNCPTR*)(Display*, GLXDrawable, unsigned long)>(IntGetProcAddress("glXSelectEventSGIX"));
    if (!sf_ptrc_glXSelectEventSGIX)
        numFailed++;
    return numFailed;
}